

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O0

int __thiscall
soplex::
ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
::number(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
         *this,DataKey *k)

{
  int iVar1;
  int iVar2;
  string *m;
  long in_RSI;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *in_RDI;
  SPxException *this_00;
  undefined1 local_31 [33];
  long local_10;
  
  if (-1 < *(int *)(in_RSI + 4)) {
    iVar1 = *(int *)(in_RSI + 4);
    local_10 = in_RSI;
    iVar2 = size(in_RDI);
    if (iVar1 < iVar2) {
      return in_RDI->theitem[*(int *)(local_10 + 4)].info;
    }
  }
  m = (string *)__cxa_allocate_exception(0x28);
  this_00 = (SPxException *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"Invalid index",(allocator *)this_00);
  SPxException::SPxException(this_00,m);
  __cxa_throw(m,&SPxException::typeinfo,SPxException::~SPxException);
}

Assistant:

int number(const DataKey& k) const
   {
      if(k.idx < 0 || k.idx >= size())
         throw SPxException("Invalid index");

      return theitem[k.idx].info;
   }